

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O3

void ZXing::DataMatrix::C40Encoder::EncodeC40
               (EncoderContext *context,
               function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *encodeChar,int encodingMode)

{
  byte bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  SymbolInfo *pSVar5;
  logic_error *this;
  string *msg;
  int iVar6;
  string *psVar7;
  int len;
  string buffer;
  string removed;
  string local_b8;
  int local_94;
  string local_90;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  iVar4 = context->_pos;
  msg = (string *)(context->_msg)._M_string_length;
  if (iVar4 < (int)msg - context->_skipAtEnd) {
    do {
      psVar7 = (string *)(long)iVar4;
      if (msg <= psVar7) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",psVar7,msg)
        ;
      }
      bVar1 = *(byte *)((long)&(psVar7->_M_dataplus)._M_p + (long)(context->_msg)._M_dataplus._M_p);
      context->_pos = iVar4 + 1;
      local_90._M_dataplus._M_p._0_4_ = (uint)bVar1;
      if ((encodeChar->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        goto LAB_00157c46;
      }
      iVar3 = (*encodeChar->_M_invoker)((_Any_data *)encodeChar,(int *)&local_90,&local_b8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_b8._M_string_length;
      len = (*(int *)&(context->_codewords).
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
            *(int *)&(context->_codewords).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) +
            (SUB164(ZEXT816(0xaaaaaaaaaaaaaaab) * auVar2,8) & 0xfffffffe);
      pSVar5 = EncoderContext::updateSymbolInfo(context,len);
      iVar4 = context->_pos;
      msg = (string *)(context->_msg)._M_string_length;
      iVar6 = (int)msg - context->_skipAtEnd;
      if (iVar6 <= iVar4) {
        local_94 = pSVar5->_dataCapacity - len;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        if ((local_b8._M_string_length * -0x5555555555555555 + 0xaaaaaaaaaaaaaaaa <
             0x5555555555555555) && (local_94 != 2)) {
          std::
          function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_70,encodeChar);
          iVar3 = BacktrackOneCharacter
                            (context,&local_b8,&local_90,iVar3,
                             (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_70);
          if (local_60 != (code *)0x0) {
            (*local_60)(&local_70,&local_70,__destroy_functor);
          }
        }
        if (0x5555555555555554 <
            local_b8._M_string_length * -0x5555555555555555 + 0x5555555555555555) goto LAB_00157ad2;
        goto LAB_00157a74;
      }
      if (local_b8._M_string_length * -0x5555555555555555 < 0x5555555555555556) {
        iVar4 = LookAheadTest((DataMatrix *)(context->_msg)._M_dataplus._M_p,msg,(long)iVar4,
                              encodingMode);
        if (iVar4 != encodingMode) {
          context->_newEncoding = 0;
          break;
        }
        iVar4 = context->_pos;
        msg = (string *)(context->_msg)._M_string_length;
        iVar6 = (int)msg - context->_skipAtEnd;
      }
    } while (iVar4 < iVar6);
  }
  goto LAB_00157af7;
  while( true ) {
    std::
    function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_50,encodeChar);
    iVar3 = BacktrackOneCharacter
                      (context,&local_b8,&local_90,iVar3,
                       (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if (0x5555555555555554 < local_b8._M_string_length * -0x5555555555555555 + 0x5555555555555555)
    break;
LAB_00157a74:
    if ((iVar3 < 4) && (local_94 == 1)) break;
  }
LAB_00157ad2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
LAB_00157af7:
  iVar3 = (int)local_b8._M_string_length;
  iVar4 = (*(int *)&(context->_codewords).
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(context->_codewords).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                   .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) + ((int)local_b8._M_string_length / 3) * 2;
  pSVar5 = EncoderContext::updateSymbolInfo(context,iVar4);
  iVar3 = iVar3 % 3;
  if (iVar3 == 2) {
    std::__cxx11::string::push_back((char)&local_b8);
    while (2 < local_b8._M_string_length) {
      WriteNextTriplet(context,&local_b8);
    }
LAB_00157be4:
    if ((int)(context->_msg)._M_string_length - context->_skipAtEnd <= context->_pos)
    goto LAB_00157bfc;
  }
  else {
    iVar4 = pSVar5->_dataCapacity - iVar4;
    if ((iVar3 == 1) && (iVar4 == 1)) {
      while (2 < local_b8._M_string_length) {
        WriteNextTriplet(context,&local_b8);
      }
      iVar4 = context->_pos;
      if (iVar4 < (int)(context->_msg)._M_string_length - context->_skipAtEnd) {
        EncoderContext::addCodeword(context,0xfe);
        iVar4 = context->_pos;
      }
      context->_pos = iVar4 + -1;
      goto LAB_00157bfc;
    }
    if (iVar3 != 0) {
LAB_00157c46:
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Unexpected case. Please report!");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    while (2 < local_b8._M_string_length) {
      WriteNextTriplet(context,&local_b8);
    }
    if (iVar4 < 1) goto LAB_00157be4;
  }
  EncoderContext::addCodeword(context,0xfe);
LAB_00157bfc:
  context->_newEncoding = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

static void EncodeC40(EncoderContext& context, std::function<int (int, std::string&)> encodeChar, int encodingMode)
	{
		//step C
		std::string buffer;
		while (context.hasMoreCharacters()) {
			int c = context.currentChar();
			context.setCurrentPos(context.currentPos() + 1);
			int lastCharSize = encodeChar(c, buffer);
			int unwritten = narrow_cast<int>(buffer.length() / 3) * 2;
			int curCodewordCount = context.codewordCount() + unwritten;
			auto symbolInfo = context.updateSymbolInfo(curCodewordCount);
			int available = symbolInfo->dataCapacity() - curCodewordCount;

			if (!context.hasMoreCharacters()) {
				//Avoid having a single C40 value in the last triplet
				std::string removed;
				if ((buffer.length() % 3) == 2 && available != 2) {
					lastCharSize = BacktrackOneCharacter(context, buffer, removed, lastCharSize, encodeChar);
				}
				while ((buffer.length() % 3) == 1 && ((lastCharSize <= 3 && available != 1) || lastCharSize > 3)) {
					lastCharSize = BacktrackOneCharacter(context, buffer, removed, lastCharSize, encodeChar);
				}
				break;
			}

			if ((buffer.length() % 3) == 0) {
				int newMode = LookAheadTest(context.message(), context.currentPos(), encodingMode);
				if (newMode != encodingMode) {
					// Return to ASCII encodation, which will actually handle latch to new mode
					context.setNewEncoding(ASCII_ENCODATION);
					break;
				}
			}
		}
		return HandleEOD(context, buffer);
	}